

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  size_type __n;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  iterator iVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  _Node *p_Var9;
  long lVar10;
  ulong uVar11;
  pointer p_Var12;
  ulong uVar13;
  ulong uVar14;
  pointer p_Var15;
  _List_iterator<CMU462::Halfedge> *hi;
  _List_iterator<CMU462::Halfedge> *p_Var16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_twin_vec;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_new_vec;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_new_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_vec;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_vec;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  pointer local_1c0;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_1a8;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  local_188;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_168;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_148;
  _List_iterator<CMU462::Halfedge> local_130;
  _List_iterator<CMU462::Halfedge> *local_128;
  iterator iStack_120;
  _List_iterator<CMU462::Halfedge> *local_118;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_108;
  pointer local_f0;
  pointer local_e8;
  _List_iterator<CMU462::Face> local_e0;
  ulong local_d8;
  pointer local_d0;
  ulong local_c8;
  Face local_c0;
  
  local_130._M_node = f._M_node[9]._M_next;
  lVar10 = 3;
  p_Var8 = local_130._M_node;
  do {
    p_Var8 = p_Var8[1]._M_prev;
    lVar10 = lVar10 + -1;
  } while (local_130._M_node != p_Var8);
  if (lVar10 != 0) {
    local_128 = (_List_iterator<CMU462::Halfedge> *)0x0;
    iStack_120._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
    local_118 = (_List_iterator<CMU462::Halfedge> *)0x0;
    uVar14 = 0xfffffffffffffffc;
    do {
      uVar18 = uVar14;
      if (iStack_120._M_current == local_118) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_128,iStack_120,&local_130);
      }
      else {
        (iStack_120._M_current)->_M_node = local_130._M_node;
        iStack_120._M_current = iStack_120._M_current + 1;
      }
      local_130._M_node = local_130._M_node[1]._M_prev;
      uVar14 = uVar18 + 1;
    } while (f._M_node[9]._M_next != local_130._M_node);
    local_108.
    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<CMU462::Vertex> *)0x0;
    local_108.
    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Vertex> *)0x0;
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::reserve(&local_108,uVar18 + 5);
    iVar6._M_current = (_List_iterator<CMU462::Halfedge> *)iStack_120;
    if (local_128 != iStack_120._M_current) {
      p_Var16 = local_128;
      do {
        if (local_108.
            super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_108.
            super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Vertex>const&>
                    ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                      *)&local_108,
                     (iterator)
                     local_108.
                     super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (_List_iterator<CMU462::Vertex> *)(p_Var16->_M_node + 2));
        }
        else {
          (local_108.
           super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var16->_M_node[2]._M_next;
          local_108.
          super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_108.
               super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        p_Var16 = p_Var16 + 1;
      } while (p_Var16 != iVar6._M_current);
    }
    local_148.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<CMU462::Halfedge> *)0x0;
    local_148.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Halfedge> *)0x0;
    local_1a8.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Halfedge> *)0x0;
    local_1a8.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<CMU462::Halfedge> *)0x0;
    __n = uVar18 + 2;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::reserve(&local_148,__n);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::reserve(&local_1a8,__n);
    local_168.
    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<CMU462::Edge> *)0x0;
    local_168.
    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Edge> *)0x0;
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    reserve(&local_168,__n);
    local_188.
    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<CMU462::Face> *)0x0;
    local_188.
    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Face> *)0x0;
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    reserve(&local_188,__n);
    if (uVar14 != 0xffffffffffffffff) {
      lVar10 = uVar18 + 2;
      do {
        p_Var8 = (_List_node_base *)operator_new(0x38);
        p_Var8[2]._M_next = (_List_node_base *)0x0;
        p_Var8[2]._M_prev = (_List_node_base *)0x0;
        p_Var8[1]._M_next = (_List_node_base *)0x0;
        p_Var8[1]._M_prev = (_List_node_base *)0x0;
        p_Var8[3]._M_next = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_c0.quadric.entries[0].x = (double)p_Var8;
        if (local_148.
            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_148.
            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)&local_148,
                     (iterator)
                     local_148.
                     super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (_List_iterator<CMU462::Halfedge> *)&local_c0);
        }
        else {
          (local_148.
           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var8;
          local_148.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_148.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        p_Var8 = (_List_node_base *)operator_new(0x38);
        p_Var8[2]._M_next = (_List_node_base *)0x0;
        p_Var8[2]._M_prev = (_List_node_base *)0x0;
        p_Var8[1]._M_next = (_List_node_base *)0x0;
        p_Var8[1]._M_prev = (_List_node_base *)0x0;
        p_Var8[3]._M_next = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_c0.quadric.entries[0].x = (double)p_Var8;
        if (local_1a8.
            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1a8.
            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)&local_1a8,
                     (iterator)
                     local_1a8.
                     super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (_List_iterator<CMU462::Halfedge> *)&local_c0);
        }
        else {
          (local_1a8.
           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var8;
          local_1a8.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1a8.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        p_Var8 = (_List_node_base *)operator_new(0x60);
        *(undefined8 *)((long)&p_Var8[1]._M_prev + 1) = 0;
        *(undefined8 *)((long)&p_Var8[2]._M_next + 1) = 0;
        p_Var8[1]._M_next = (_List_node_base *)0x0;
        p_Var8[1]._M_prev = (_List_node_base *)0x0;
        p_Var8[3]._M_next = (_List_node_base *)0x0;
        p_Var8[3]._M_prev = (_List_node_base *)0x0;
        p_Var8[4]._M_next = (_List_node_base *)0x0;
        p_Var8[4]._M_prev = (_List_node_base *)0x0;
        p_Var8[5]._M_next = (_List_node_base *)0x0;
        p_Var8[5]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_c0.quadric.entries[0].x = (double)p_Var8;
        if (local_168.
            super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_168.
            super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Edge>>
                    ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                      *)&local_168,
                     (iterator)
                     local_168.
                     super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (_List_iterator<CMU462::Edge> *)&local_c0);
        }
        else {
          (local_168.
           super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var8;
          local_168.
          super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_168.
               super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        memset(&local_c0,0,0x89);
        p_Var9 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::
                 _M_create_node<CMU462::Face>(&this->faces,&local_c0);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar1 = &(this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_e0._M_node = &p_Var9->super__List_node_base;
        if (local_188.
            super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_188.
            super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Face>>
                    ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                      *)&local_188,
                     (iterator)
                     local_188.
                     super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_e0);
        }
        else {
          (local_188.
           super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = &p_Var9->super__List_node_base;
          local_188.
          super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_188.
               super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      lVar10 = 0;
      do {
        local_168.
        super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_node[5]._M_prev =
             local_148.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_node;
        local_188.
        super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_node[9]._M_next =
             local_1a8.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_node;
        lVar10 = lVar10 + 1;
      } while (uVar18 + 2 != lVar10);
    }
    local_d8 = uVar18 + 4;
    p_Var8 = (local_148.
              super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    local_f0 = local_1a8.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (local_1a8.
              super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    p_Var3 = local_108.
             super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_node;
    p_Var4 = (local_168.
              super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    p_Var8[1]._M_prev = local_128->_M_node;
    p_Var8[1]._M_next = p_Var2;
    p_Var8[2]._M_next = p_Var3;
    p_Var8[2]._M_prev = p_Var4;
    p_Var8[3]._M_next = f._M_node;
    local_e8 = local_148.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_128[1]._M_node[1]._M_prev =
         (local_148.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    uVar18 = local_d8;
    if (uVar14 == 0) {
      uVar11 = 2;
      uVar13 = 0;
    }
    else {
      lVar10 = 8;
      uVar20 = 0;
      local_d0 = local_188.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = 2;
      uVar19 = 0;
      do {
        uVar11 = uVar18;
        uVar13 = uVar7;
        p_Var8 = local_188.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_node;
        if ((uVar20 & 1) == 0) {
          local_1c0 = local_1a8.
                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar20;
          p_Var2 = local_1c0->_M_node;
          p_Var12 = (pointer)((long)&(local_148.
                                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_node + lVar10);
          p_Var5 = (local_148.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar20)[1]._M_node;
          p_Var3 = local_108.
                   super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_node;
          p_Var4 = local_168.
                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_node;
          p_Var2[1]._M_next =
               local_148.
               super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_node;
          p_Var2[1]._M_prev = p_Var5;
          p_Var2[2]._M_next = p_Var3;
          p_Var2[2]._M_prev = p_Var4;
          p_Var2[3]._M_next = p_Var8;
          p_Var15 = (pointer)((long)&(local_1a8.
                                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_node + lVar10);
          lVar17 = 1;
          uVar18 = uVar20 | 1;
          uVar19 = uVar11;
        }
        else {
          p_Var15 = local_148.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar20;
          p_Var2 = p_Var15[1]._M_node;
          p_Var12 = local_1a8.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar20;
          p_Var3 = p_Var12[1]._M_node;
          p_Var4 = local_108.
                   super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
          p_Var5 = local_168.
                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20 + 1]._M_node;
          p_Var2[1]._M_prev = p_Var12->_M_node;
          p_Var2[1]._M_next = p_Var3;
          p_Var2[2]._M_next = p_Var4;
          p_Var2[2]._M_prev = p_Var5;
          local_1c0 = (pointer)((long)&(local_148.
                                        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_node + lVar10
                               );
          p_Var2[3]._M_next = p_Var8;
          lVar17 = -1;
          uVar18 = uVar20;
        }
        p_Var8 = p_Var12->_M_node;
        p_Var2 = p_Var15->_M_node;
        p_Var3 = local_108.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_node;
        p_Var4 = local_168.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var5 = local_188.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_node;
        p_Var8[1]._M_prev = local_128[uVar19]._M_node;
        p_Var8[1]._M_next = p_Var2;
        p_Var8[2]._M_next = p_Var3;
        p_Var8[2]._M_prev = p_Var4;
        p_Var8[3]._M_next = p_Var5;
        local_128[uVar19]._M_node[1]._M_prev = local_1c0->_M_node;
        local_128[uVar19]._M_node[3]._M_next =
             local_188.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_node;
        uVar18 = lVar17 + uVar13;
        uVar20 = uVar20 + 1;
        lVar10 = lVar10 + 8;
        uVar7 = uVar11;
        uVar19 = uVar13;
        local_c8 = uVar14;
      } while (uVar14 != uVar20);
    }
    p_Var8 = local_1a8.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    p_Var2 = local_148.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    p_Var3 = local_168.
             super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    p_Var4 = local_188.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    uVar14 = uVar13;
    if ((local_d8 & 1) == 0) {
      uVar14 = uVar11;
      uVar11 = uVar13;
    }
    p_Var5 = local_108.
             super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_node;
    p_Var8[1]._M_prev = local_128[uVar11]._M_node;
    p_Var8[1]._M_next = p_Var2;
    p_Var8[2]._M_next = p_Var5;
    p_Var8[2]._M_prev = p_Var3;
    p_Var8[3]._M_next = p_Var4;
    local_128[uVar11]._M_node[3]._M_next =
         local_188.
         super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    local_128[uVar18]._M_node[3]._M_next =
         local_188.
         super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    local_128[uVar18]._M_node[1]._M_prev =
         local_1a8.
         super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    if (local_188.
        super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.
                      super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_188.
                            super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.
                            super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_168.
        super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.
                      super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.
                            super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.
                            super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a8.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_148.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.
                      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_148.
                            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.
                            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.
        super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.
                      super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_128 != (_List_iterator<CMU462::Halfedge> *)0x0) {
      operator_delete(local_128,(long)local_118 - (long)local_128);
    }
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
  // Triangulate a polygonal face

  // If already triangle, return
  if (f->degree() == 3) {
    return;
  }

  // Collect
  // HalfEdges
  auto h = f->halfedge();
  size_t degree = 0;
  vector<HalfedgeIter> h_outer_vec;
  do {
    ++degree;
    h_outer_vec.push_back(h);
    h = h->next();
  } while (h != f->halfedge());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.reserve(degree);
  for (const auto& hi : h_outer_vec) {
    v_outer_vec.push_back(hi->vertex());
  }

  // Allocate
  // HalfEdges
  vector<HalfedgeIter> h_new_vec, h_new_twin_vec;
  h_new_vec.reserve(degree - 3);
  h_new_twin_vec.reserve(degree - 3);

  // Edges
  vector<EdgeIter> e_new_vec;
  e_new_vec.reserve(degree - 3);

  // Faces
  vector<FaceIter> f_new_vec;
  f_new_vec.reserve(degree - 3);

  for (size_t i = 0; i < degree - 3; ++i) {
    h_new_vec.push_back(newHalfedge());
    h_new_twin_vec.push_back(newHalfedge());

    e_new_vec.push_back(newEdge());

    f_new_vec.push_back(newFace());
  }

  // Reassign
  // New edges and faces
  for (size_t i = 0; i < degree - 3; ++i) {
    e_new_vec[i]->halfedge() = h_new_vec[i];
    f_new_vec[i]->halfedge() = h_new_twin_vec[i];
  }

  // Halfedges of the first face
  h_new_vec[0]->setNeighbors(h_outer_vec[0],
                             h_new_twin_vec[0],
                             v_outer_vec[2],
                             e_new_vec[0],
                             f);
  h_outer_vec[1]->next() = h_new_vec[0];

  // Halfedges of the middle faces
  size_t first_v = 0, second_v = 2, third_v = degree - 1, t;
  for (size_t i = 0; i < degree - 4; ++i) {
    if (i % 2 == 0) {
      h_new_twin_vec[i]->setNeighbors(h_new_vec[i + 1],
                                      h_new_vec[i],
                                      v_outer_vec[first_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_new_vec[i + 1]->setNeighbors(h_outer_vec[third_v],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[second_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_outer_vec[third_v]->next() = h_new_twin_vec[i];
      h_outer_vec[third_v]->face() = f_new_vec[i];
      t = second_v + 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    } else {
      h_new_vec[i + 1]->setNeighbors(h_new_twin_vec[i],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[third_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_new_twin_vec[i]->setNeighbors(h_outer_vec[first_v],
                                      h_new_vec[i],
                                      v_outer_vec[second_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_outer_vec[first_v]->next() = h_new_vec[i + 1];
      h_outer_vec[first_v]->face() = f_new_vec[i];
      t = second_v - 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    }
  }

  // Halfedges of the final faces
  if (degree % 2 == 0) {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[second_v],
                                        h_new_vec.back(),
                                        v_outer_vec[first_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[second_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  } else {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[first_v],
                                        h_new_vec.back(),
                                        v_outer_vec[second_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[first_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  }
}